

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::mktree(Path *this)

{
  bool bVar1;
  __mode_t extraout_EDX;
  __mode_t extraout_EDX_00;
  __mode_t __mode;
  Path *__path;
  undefined1 local_30 [8];
  Path p;
  Path *this_local;
  
  p._24_8_ = this;
  bVar1 = is_root(this);
  if ((!bVar1) && (bVar1 = is_directory(this), !bVar1)) {
    __path = this;
    parent((Path *)local_30,this);
    bVar1 = is_directory((Path *)local_30);
    __mode = extraout_EDX;
    if (!bVar1) {
      mktree((Path *)local_30);
      __mode = extraout_EDX_00;
    }
    mkdir(this,(char *)__path,__mode);
    ~Path((Path *)local_30);
  }
  return;
}

Assistant:

void Path::mktree() const
{
  // Root is required to exist
  if (is_root())
    return;

  if (!is_directory()) {
    Path p = parent();

    if (!p.is_directory()) {
      p.mktree();
    }

    mkdir();
  }

}